

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkConverLatchNamesIntoNumbers(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *p;
  int *piVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  pVVar5 = pNtk->vOnehots;
  if (pVVar5 == (Vec_Ptr_t *)0x0) {
    pVVar5 = (Vec_Ptr_t *)0x0;
  }
  else {
    lVar10 = (long)pNtk->vBoxes->nSize;
    if (0 < lVar10) {
      ppvVar6 = pNtk->vBoxes->pArray;
      lVar12 = 0;
      do {
        pvVar2 = ppvVar6[lVar12];
        if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 8) {
          *(long *)((long)pvVar2 + 8) = lVar12;
        }
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
    iVar11 = pVVar5->nSize;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    iVar9 = 8;
    if (6 < iVar11 - 1U) {
      iVar9 = iVar11;
    }
    pVVar5->nSize = 0;
    pVVar5->nCap = iVar9;
    if (iVar9 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar9 << 3);
    }
    pVVar5->pArray = ppvVar6;
    pVVar7 = pNtk->vOnehots;
    if (0 < pVVar7->nSize) {
      lVar10 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar10];
        iVar11 = *(int *)((long)pvVar2 + 4);
        p = (Vec_Int_t *)malloc(0x10);
        if (iVar11 - 1U < 0xf) {
          iVar11 = 0x10;
        }
        p->nSize = 0;
        p->nCap = iVar11;
        if (iVar11 == 0) {
          piVar8 = (int *)0x0;
        }
        else {
          piVar8 = (int *)malloc((long)iVar11 << 2);
        }
        p->pArray = piVar8;
        if (0 < *(int *)((long)pvVar2 + 4)) {
          lVar12 = 0;
          do {
            uVar4 = Nm_ManFindIdByName(pNtk->pManName,
                                       *(char **)(*(long *)((long)pvVar2 + 8) + lVar12 * 8),5);
            if (-1 < (int)uVar4) {
              if (pNtk->vObjs->nSize <= (int)uVar4) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              plVar3 = (long *)pNtk->vObjs->pArray[uVar4];
              if ((*(int *)((long)plVar3 + 0x1c) == 1) &&
                 ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                      (long)*(int *)plVar3[4] * 8) + 0x14) & 0xf) == 8)) {
                Vec_IntPush(p,(int)plVar3[1]);
              }
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)pvVar2 + 4));
        }
        if (p->nSize < 2) {
          if (p->pArray != (int *)0x0) {
            free(p->pArray);
            p->pArray = (int *)0x0;
          }
          free(p);
        }
        else {
          uVar4 = pVVar5->nSize;
          uVar1 = pVVar5->nCap;
          if (uVar4 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
              }
              iVar11 = 0x10;
            }
            else {
              iVar11 = uVar1 * 2;
              if (iVar11 <= (int)uVar1) goto LAB_00866f0e;
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
              }
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = iVar11;
          }
LAB_00866f0e:
          pVVar5->nSize = uVar4 + 1;
          pVVar5->pArray[(int)uVar4] = p;
          printf("Converted %d one-hot registers.\n",(ulong)(uint)p->nSize);
        }
        lVar10 = lVar10 + 1;
        pVVar7 = pNtk->vOnehots;
      } while (lVar10 < pVVar7->nSize);
    }
    lVar10 = (long)pNtk->vBoxes->nSize;
    if (0 < lVar10) {
      ppvVar6 = pNtk->vBoxes->pArray;
      lVar12 = 0;
      do {
        pvVar2 = ppvVar6[lVar12];
        if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 8) {
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Abc_NtkConverLatchNamesIntoNumbers( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vResult, * vNames;
    Vec_Int_t * vNumbers;
    Abc_Obj_t * pObj;
    char * pName;
    int i, k, Num;
    if ( pNtk->vOnehots == NULL )
        return NULL;
    // set register numbers
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // add the numbers
    vResult = Vec_PtrAlloc( Vec_PtrSize(pNtk->vOnehots) );
    Vec_PtrForEachEntry( Vec_Ptr_t *, pNtk->vOnehots, vNames, i )
    {
        vNumbers = Vec_IntAlloc( Vec_PtrSize(vNames) );
        Vec_PtrForEachEntry( char *, vNames, pName, k )
        {
            Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_BO );
            if ( Num < 0 )
                continue;
            pObj = Abc_NtkObj( pNtk, Num );
            if ( Abc_ObjFaninNum(pObj) != 1 || !Abc_ObjIsLatch(Abc_ObjFanin0(pObj)) )
                continue;
            Vec_IntPush( vNumbers, (int)(ABC_PTRINT_T)pObj->pNext );
        }
        if ( Vec_IntSize( vNumbers ) > 1 )
        {
            Vec_PtrPush( vResult, vNumbers );
printf( "Converted %d one-hot registers.\n", Vec_IntSize(vNumbers) );
        }
        else
            Vec_IntFree( vNumbers );
    }
    // clean the numbers
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pNext = NULL;
    return vResult;
}